

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  LogMessage *other;
  int i;
  int index;
  long lVar5;
  long local_120;
  key_type local_10c;
  DescriptorBuilder *local_108;
  EnumDescriptorProto *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string error;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  LogMessage local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_108 = this;
  local_100 = proto;
  for (index = 0; iVar2 = *(int *)(enm + 0x2c), index < iVar2; index = index + 1) {
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
              (&(proto->value_).super_RepeatedPtrFieldBase,index);
  }
  if (((*(byte *)(*(long *)(enm + 0x20) + 0x60) & 1) == 0) ||
     (*(char *)(*(long *)(enm + 0x20) + 0x58) == '\0')) {
    used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &used_values._M_t._M_impl.super__Rb_tree_header._M_header;
    used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    used_values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_120 = 0x10;
    used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
      lVar1 = *(long *)(enm + 0x30);
      local_88.level_ = *(LogLevel *)(lVar1 + local_120);
      iVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&used_values._M_t,(key_type *)&local_88);
      if ((_Rb_tree_header *)iVar3._M_node == &used_values._M_t._M_impl.super__Rb_tree_header) {
        local_88.level_ = *(LogLevel *)(lVar1 + local_120);
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&used_values._M_t,(key_type *)&local_88);
        std::__cxx11::string::_M_assign((string *)pmVar4);
      }
      else {
        std::operator+(&local_50,"\"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar1 + -8 + local_120));
        std::operator+(&local_f8,&local_50,"\" uses the same enum value as \"");
        local_10c = *(key_type *)(lVar1 + local_120);
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&used_values._M_t,&local_10c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_88,&local_f8,pmVar4);
        std::operator+(&error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_88,
                       "\". If this is intended, set \'option allow_alias = true;\' to the enum definition."
                      );
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_50);
        if (*(char *)(*(long *)(enm + 0x20) + 0x58) == '\0') {
          AddError(local_108,*(string **)(enm + 8),&local_100->super_Message,NUMBER,&error);
        }
        else {
          internal::LogMessage::LogMessage
                    (&local_88,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                     ,0x1039);
          other = internal::LogMessage::operator<<(&local_88,&error);
          internal::LogFinisher::operator=((LogFinisher *)&local_f8,other);
          internal::LogMessage::~LogMessage(&local_88);
        }
        std::__cxx11::string::~string((string *)&error);
      }
      iVar2 = *(int *)(enm + 0x2c);
      local_120 = local_120 + 0x28;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&used_values._M_t);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    map<int, string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] + "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER,
                   error);
        } else {
          // Generate warning if duplicated values are found but the option
          // isn't set.
          GOOGLE_LOG(ERROR) << error;
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}